

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglClientExtensionTests.cpp
# Opt level: O2

IterateResult __thiscall deqp::egl::anon_unknown_0::BaseTest::iterate(BaseTest *this)

{
  ostringstream *this_00;
  bool bVar1;
  int iVar2;
  deUint32 errCode;
  Library *pLVar3;
  undefined4 extraout_var;
  istream *piVar4;
  TestError *this_01;
  char *description;
  qpTestResult testResult;
  pointer_____offset_0x10___ *ppuVar5;
  string extension;
  MessageBuilder local_328;
  istringstream stream;
  
  pLVar3 = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  iVar2 = (*pLVar3->_vptr_Library[0x2a])(pLVar3,0,0x3055);
  errCode = (*pLVar3->_vptr_Library[0x1f])(pLVar3);
  if (errCode == 0x3000) {
    if ((char *)CONCAT44(extraout_var,iVar2) != (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_328,(char *)CONCAT44(extraout_var,iVar2),
                 (allocator<char> *)&extension);
      std::__cxx11::istringstream::istringstream
                ((istringstream *)&stream,(string *)&local_328,_S_in);
      std::__cxx11::string::~string((string *)&local_328);
      extension._M_dataplus._M_p = (pointer)&extension.field_2;
      extension._M_string_length = 0;
      extension.field_2._M_local_buf[0] = '\0';
      do {
        piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)&stream,(string *)&extension,' ');
        if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) {
          local_328.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          this_00 = &local_328.m_str;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
          std::operator<<((ostream *)this_00,
                          "eglQueryString(EGL_NO_DISPLAY, EGL_EXTENSIONS) didn\'t fail, but extension string doesn\'t contain EGL_EXT_client_extensions"
                         );
          tcu::MessageBuilder::operator<<(&local_328,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
          description = "Fail";
          testResult = QP_TEST_RESULT_FAIL;
          goto LAB_0020e855;
        }
        bVar1 = std::operator==(&extension,"EGL_EXT_client_extensions");
      } while (!bVar1);
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
LAB_0020e855:
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,testResult,
                 description);
      std::__cxx11::string::~string((string *)&extension);
      std::__cxx11::istringstream::~istringstream((istringstream *)&stream);
      return STOP;
    }
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_01,(char *)0x0,"clientExtesionsStr",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglClientExtensionTests.cpp"
               ,0x91);
    ppuVar5 = &tcu::TestError::typeinfo;
  }
  else if (errCode == 0x3008) {
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              ((NotSupportedError *)this_01,"EGL_EXT_client_extensions not supported",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglClientExtensionTests.cpp"
               ,0x8d);
    ppuVar5 = &tcu::NotSupportedError::typeinfo;
  }
  else {
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    eglu::Error::Error((Error *)this_01,errCode,"eglQueryString()",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglClientExtensionTests.cpp"
                       ,0x8f);
    ppuVar5 = &eglu::Error::typeinfo;
  }
  __cxa_throw(this_01,ppuVar5,tcu::Exception::~Exception);
}

Assistant:

TestCase::IterateResult BaseTest::iterate (void)
{
	const Library&		egl					= m_eglTestCtx.getLibrary();
	const char* const	clientExtesionsStr	= egl.queryString(EGL_NO_DISPLAY, EGL_EXTENSIONS);
	const EGLint		eglError			= egl.getError();

	if (eglError == EGL_BAD_DISPLAY)
		TCU_THROW(NotSupportedError, "EGL_EXT_client_extensions not supported");
	else if (eglError != EGL_SUCCESS)
		throw eglu::Error(eglError, "eglQueryString()", DE_NULL, __FILE__, __LINE__);

	TCU_CHECK(clientExtesionsStr);

	{
		bool				found		= false;
		std::istringstream	stream		(clientExtesionsStr);
		string				extension;

		while (std::getline(stream, extension, ' '))
		{
			if (extension == "EGL_EXT_client_extensions")
			{
				found = true;
				break;
			}
		}

		if (found)
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		else
		{
			m_testCtx.getLog() << TestLog::Message << "eglQueryString(EGL_NO_DISPLAY, EGL_EXTENSIONS) didn't fail, but extension string doesn't contain EGL_EXT_client_extensions" <<TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}